

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainerSGD.cpp
# Opt level: O2

DNN_NUMERIC __thiscall tfs::DnnTrainerSGD::adjustWeights(DnnTrainerSGD *this)

{
  double dVar1;
  double dVar2;
  unsigned_long uVar3;
  double dVar4;
  Trainable **ppTVar5;
  Trainable *pTVar6;
  double *pdVar7;
  double *pdVar8;
  Matrix *pMVar9;
  double *pdVar10;
  Trainable **ppTVar11;
  double *pdVar12;
  double *pdVar13;
  char *format;
  double dVar14;
  double dVar15;
  double dVar16;
  unsigned_long uStack_10;
  
  if ((this->super_DnnTrainer).m_momentum <= 0.0) {
    pdVar10 = (double *)0x0;
  }
  else {
    pMVar9 = (this->super_DnnTrainer).m_gsum;
    if (pMVar9 == (Matrix *)0x0) {
      DnnTrainer::setupSums(&this->super_DnnTrainer,false);
      pMVar9 = (this->super_DnnTrainer).m_gsum;
    }
    pdVar10 = pMVar9->m_data;
  }
  ppTVar11 = (this->super_DnnTrainer).m_trainable_handle;
  ppTVar5 = (this->super_DnnTrainer).m_trainable_end;
  do {
    if (ppTVar5 <= ppTVar11) {
LAB_001196e3:
      return (this->super_DnnTrainer).m_loss;
    }
    pTVar6 = *ppTVar11;
    pdVar12 = pTVar6->weightStart;
    if ((pdVar12 == (double *)0x0) || (pdVar13 = pTVar6->gradientStart, pdVar13 == (double *)0x0)) {
      format = "Trainable has weight or gradient == 0";
      uStack_10 = 0x2c;
LAB_001196db:
      report_problem("Error",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainerSGD.cpp"
                     ,"adjustWeights",uStack_10,format);
      goto LAB_001196e3;
    }
    ppTVar11 = ppTVar11 + 1;
    pdVar7 = pTVar6->weightEnd;
    pdVar8 = pTVar6->gradientEnd;
    dVar1 = (this->super_DnnTrainer).m_l2_decay;
    dVar14 = (this->super_DnnTrainer).m_l1_decay * pTVar6->l1_decay_mul;
    dVar2 = pTVar6->l2_decay_mul;
    uVar3 = (this->super_DnnTrainer).m_batch_size;
    for (; pdVar12 < pdVar7; pdVar12 = pdVar12 + 1) {
      if (pdVar8 <= pdVar13) {
        format = "Trainable has gradient[] smaller than weight[] in size.";
        uStack_10 = 0x38;
        goto LAB_001196db;
      }
      dVar16 = *pdVar12;
      dVar15 = (dVar1 * dVar2 * dVar16 +
                (double)(~-(ulong)(0.0 < dVar16) & (ulong)-dVar14 |
                        -(ulong)(0.0 < dVar16) & (ulong)dVar14) + *pdVar13) /
               (((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
      dVar4 = (this->super_DnnTrainer).m_momentum;
      if ((dVar4 <= 0.0) || (pdVar10 == (double *)0x0)) {
        dVar16 = dVar16 - dVar15 * (this->super_DnnTrainer).m_learning_rate;
      }
      else {
        dVar16 = dVar4 * *pdVar10 - dVar15 * (this->super_DnnTrainer).m_learning_rate;
        *pdVar10 = dVar16;
        pdVar10 = pdVar10 + 1;
        dVar16 = dVar16 + *pdVar12;
      }
      *pdVar12 = dVar16;
      *pdVar13 = 0.0;
      pdVar13 = pdVar13 + 1;
    }
  } while( true );
}

Assistant:

DNN_NUMERIC
    DnnTrainerSGD::adjustWeights( void ) {
        DNN_NUMERIC *gsum = 0;
        if( m_momentum > 0.0 ) {
            if( m_gsum == 0 ) {
                setupSums( false );  // setup only gsum[]
            }
            gsum = m_gsum->data();
        }
        
        Trainable **trainableHandle = m_trainable_handle;
        Trainable **trainableEnd    = m_trainable_end;
        
        while( trainableHandle < trainableEnd ) {
                  Trainable   *trainable   = *trainableHandle++;      // trainable != 0 & ok() from DnnTrainer::setUpTrainables()
                  DNN_NUMERIC *weight      = trainable->weightStart;
            const DNN_NUMERIC *weightEnd   = trainable->weightEnd;
                  DNN_NUMERIC *gradient    = trainable->gradientStart;
            const DNN_NUMERIC *gradientEnd = trainable->gradientEnd;
            const DNN_NUMERIC l1_decay     = m_l1_decay * trainable->l1_decay_mul;
            const DNN_NUMERIC l2_decay     = m_l2_decay * trainable->l2_decay_mul;
            
            if( weight == 0 || gradient == 0 ) {
                log_error( "Trainable has weight or gradient == 0" );
                return m_loss;
            }
            
            while( weight < weightEnd ) {
                const DNN_NUMERIC     ww = *weight;
                const DNN_NUMERIC l1grad = l1_decay * (ww > 0.0 ? 1.0 : -1.0);
                const DNN_NUMERIC l2grad = l2_decay * ww;
                
                const DNN_NUMERIC gij = ( l1grad + l2grad + *gradient ) / m_batch_size; // raw batch gradient
                
                if( gradient >= gradientEnd ) {
                    log_error( "Trainable has gradient[] smaller than weight[] in size." );
                    return m_loss;
                }
                if( m_momentum > 0.0 && gsum != 0 ) {
                    const DNN_NUMERIC dx = m_momentum * *gsum - m_learning_rate * gij;
                    *gsum++    = dx;    // Save next momentum iteration
                    *weight++ += dx;    // apply corrected gradient
                } else {
                    *weight++ -= m_learning_rate * gij;
                }
                *gradient++ = 0.0;
            }
        }
        return m_loss;
    }